

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseType(Parser *this,Type *type)

{
  bool bVar1;
  char *s;
  undefined8 *in_RDX;
  allocator<char> local_171;
  string local_170 [39];
  byte local_149;
  Type local_148;
  byte local_121;
  Type local_120;
  allocator<char> local_f9;
  string local_f8 [35];
  undefined1 local_d5;
  unsigned_short local_d4;
  allocator<char> local_d1;
  string local_d0 [3];
  bool check;
  uint16_t fixed_length;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8 [39];
  byte local_81;
  undefined1 local_80 [8];
  Type subtype;
  undefined1 local_58 [8];
  ParseDepthGuard depth_guard;
  Type *type_local;
  Parser *this_local;
  CheckedError *ce;
  
  if (*(int *)&type->field_0x1c == 0x104) {
    bVar1 = IsIdent((Parser *)type,"bool");
    if (bVar1) {
      *(undefined4 *)in_RDX = 2;
      Next(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) goto LAB_00123bc1;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    else {
      bVar1 = IsIdent((Parser *)type,"byte");
      if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"int8"), bVar1)) {
        *(undefined4 *)in_RDX = 3;
        Next(this);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (bVar1) goto LAB_00123bc1;
        CheckedError::~CheckedError((CheckedError *)this);
      }
      else {
        bVar1 = IsIdent((Parser *)type,"ubyte");
        if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"uint8"), bVar1)) {
          *(undefined4 *)in_RDX = 4;
          Next(this);
          bVar1 = CheckedError::Check((CheckedError *)this);
          if (bVar1) goto LAB_00123bc1;
          CheckedError::~CheckedError((CheckedError *)this);
        }
        else {
          bVar1 = IsIdent((Parser *)type,"short");
          if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"int16"), bVar1)) {
            *(undefined4 *)in_RDX = 5;
            Next(this);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) goto LAB_00123bc1;
            CheckedError::~CheckedError((CheckedError *)this);
          }
          else {
            bVar1 = IsIdent((Parser *)type,"ushort");
            if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"uint16"), bVar1)) {
              *(undefined4 *)in_RDX = 6;
              Next(this);
              bVar1 = CheckedError::Check((CheckedError *)this);
              if (bVar1) goto LAB_00123bc1;
              CheckedError::~CheckedError((CheckedError *)this);
            }
            else {
              bVar1 = IsIdent((Parser *)type,"int");
              if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"int32"), bVar1)) {
                *(undefined4 *)in_RDX = 7;
                Next(this);
                bVar1 = CheckedError::Check((CheckedError *)this);
                if (bVar1) goto LAB_00123bc1;
                CheckedError::~CheckedError((CheckedError *)this);
              }
              else {
                bVar1 = IsIdent((Parser *)type,"uint");
                if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"uint32"), bVar1)) {
                  *(undefined4 *)in_RDX = 8;
                  Next(this);
                  bVar1 = CheckedError::Check((CheckedError *)this);
                  if (bVar1) goto LAB_00123bc1;
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                else {
                  bVar1 = IsIdent((Parser *)type,"long");
                  if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"int64"), bVar1)) {
                    *(undefined4 *)in_RDX = 9;
                    Next(this);
                    bVar1 = CheckedError::Check((CheckedError *)this);
                    if (bVar1) goto LAB_00123bc1;
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  else {
                    bVar1 = IsIdent((Parser *)type,"ulong");
                    if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"uint64"), bVar1)) {
                      *(undefined4 *)in_RDX = 10;
                      Next(this);
                      bVar1 = CheckedError::Check((CheckedError *)this);
                      if (bVar1) goto LAB_00123bc1;
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    else {
                      bVar1 = IsIdent((Parser *)type,"float");
                      if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"float32"), bVar1)) {
                        *(undefined4 *)in_RDX = 0xb;
                        depth_guard._15_1_ = 0;
                        Next(this);
                        bVar1 = CheckedError::Check((CheckedError *)this);
                        if (bVar1) {
                          depth_guard._15_1_ = 1;
                        }
                        if ((depth_guard._15_1_ & 1) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        if (bVar1) goto LAB_00123bc1;
                      }
                      else {
                        bVar1 = IsIdent((Parser *)type,"double");
                        if ((bVar1) || (bVar1 = IsIdent((Parser *)type,"float64"), bVar1)) {
                          *(undefined4 *)in_RDX = 0xc;
                          depth_guard._14_1_ = 0;
                          Next(this);
                          bVar1 = CheckedError::Check((CheckedError *)this);
                          if (bVar1) {
                            depth_guard._14_1_ = 1;
                          }
                          if ((depth_guard._14_1_ & 1) == 0) {
                            CheckedError::~CheckedError((CheckedError *)this);
                          }
                          if (bVar1) goto LAB_00123bc1;
                        }
                        else {
                          bVar1 = IsIdent((Parser *)type,"string");
                          if (bVar1) {
                            *(undefined4 *)in_RDX = 0xd;
                            depth_guard._13_1_ = 0;
                            Next(this);
                            bVar1 = CheckedError::Check((CheckedError *)this);
                            if (bVar1) {
                              depth_guard._13_1_ = 1;
                            }
                            if ((depth_guard._13_1_ & 1) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (bVar1) goto LAB_00123bc1;
                          }
                          else {
                            depth_guard._12_1_ = 0;
                            ParseTypeIdent(this,type);
                            bVar1 = CheckedError::Check((CheckedError *)this);
                            if (bVar1) {
                              depth_guard._12_1_ = 1;
                            }
                            if ((depth_guard._12_1_ & 1) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (bVar1) goto LAB_00123bc1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (*(int *)&type->field_0x1c != 0x5b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_170,"illegal type syntax",&local_171)
      ;
      Error(this,(string *)type);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator(&local_171);
      goto LAB_00123bc1;
    }
    ParseDepthGuard::ParseDepthGuard((ParseDepthGuard *)local_58,(Parser *)type);
    subtype._31_1_ = 0;
    ParseDepthGuard::Check((ParseDepthGuard *)this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) {
      subtype._31_1_ = 1;
    }
    if ((subtype._31_1_ & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!bVar1) {
      subtype._30_1_ = 0;
      Next(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) {
        subtype._30_1_ = 1;
      }
      if ((subtype._30_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (!bVar1) {
        Type::Type((Type *)local_80,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
        local_81 = 0;
        ParseType(this,type);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (bVar1) {
          local_81 = 1;
        }
        if ((local_81 & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (!bVar1) {
          bVar1 = IsSeries((Type *)local_80);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_a8,"nested vector types not supported (wrap in table first)",&local_a9)
            ;
            Error(this,(string *)type);
            std::__cxx11::string::~string(local_a8);
            std::allocator<char>::~allocator(&local_a9);
            bVar1 = true;
          }
          else if (*(int *)&type->field_0x1c == 0x3a) {
            local_aa = 0;
            Next(this);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_aa = 1;
            }
            if ((local_aa & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar1) {
              if (*(int *)&type->field_0x1c == 0x102) {
                local_d4 = 0;
                s = (char *)std::__cxx11::string::c_str();
                local_d5 = StringToNumber<unsigned_short>(s,&local_d4);
                if (((bool)local_d5) && (local_d4 != 0)) {
                  Type::Type(&local_120,BASE_TYPE_ARRAY,(StructDef *)subtype._0_8_,
                             (EnumDef *)subtype.struct_def,local_d4);
                  *(ulong *)((long)in_RDX + 10) =
                       CONCAT26(local_120.enum_def._0_2_,local_120.struct_def._2_6_);
                  *(undefined8 *)((long)in_RDX + 0x12) = local_120._18_8_;
                  *in_RDX = local_120._0_8_;
                  in_RDX[1] = CONCAT62(local_120.struct_def._2_6_,local_120.struct_def._0_2_);
                  local_121 = 0;
                  Next(this);
                  bVar1 = CheckedError::Check((CheckedError *)this);
                  if (bVar1) {
                    local_121 = 1;
                  }
                  if ((local_121 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (!bVar1) goto LAB_00123a4f;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_f8,
                             "length of fixed-length array must be positive and fit to uint16_t type"
                             ,&local_f9);
                  Error(this,(string *)type);
                  std::__cxx11::string::~string(local_f8);
                  std::allocator<char>::~allocator(&local_f9);
                  bVar1 = true;
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (local_d0,"length of fixed-length array must be an integer value",
                           &local_d1);
                Error(this,(string *)type);
                std::__cxx11::string::~string(local_d0);
                std::allocator<char>::~allocator(&local_d1);
                bVar1 = true;
              }
            }
          }
          else {
            Type::Type(&local_148,BASE_TYPE_VECTOR,(StructDef *)subtype._0_8_,
                       (EnumDef *)subtype.struct_def,0);
            *in_RDX = local_148._0_8_;
            in_RDX[1] = local_148.struct_def;
            in_RDX[2] = local_148.enum_def;
            *(uint16_t *)(in_RDX + 3) = local_148.fixed_length;
LAB_00123a4f:
            *(undefined4 *)((long)in_RDX + 4) = local_80._0_4_;
            local_149 = 0;
            Expect(this,(int)type);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_149 = 1;
            }
            if ((local_149 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar1) {
              bVar1 = false;
            }
          }
        }
      }
    }
    ParseDepthGuard::~ParseDepthGuard((ParseDepthGuard *)local_58);
    if (bVar1 != false) goto LAB_00123bc1;
  }
  anon_unknown_0::NoError();
LAB_00123bc1:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseType(Type &type) {
  if (token_ == kTokenIdentifier) {
    if (IsIdent("bool")) {
      type.base_type = BASE_TYPE_BOOL;
      NEXT();
    } else if (IsIdent("byte") || IsIdent("int8")) {
      type.base_type = BASE_TYPE_CHAR;
      NEXT();
    } else if (IsIdent("ubyte") || IsIdent("uint8")) {
      type.base_type = BASE_TYPE_UCHAR;
      NEXT();
    } else if (IsIdent("short") || IsIdent("int16")) {
      type.base_type = BASE_TYPE_SHORT;
      NEXT();
    } else if (IsIdent("ushort") || IsIdent("uint16")) {
      type.base_type = BASE_TYPE_USHORT;
      NEXT();
    } else if (IsIdent("int") || IsIdent("int32")) {
      type.base_type = BASE_TYPE_INT;
      NEXT();
    } else if (IsIdent("uint") || IsIdent("uint32")) {
      type.base_type = BASE_TYPE_UINT;
      NEXT();
    } else if (IsIdent("long") || IsIdent("int64")) {
      type.base_type = BASE_TYPE_LONG;
      NEXT();
    } else if (IsIdent("ulong") || IsIdent("uint64")) {
      type.base_type = BASE_TYPE_ULONG;
      NEXT();
    } else if (IsIdent("float") || IsIdent("float32")) {
      type.base_type = BASE_TYPE_FLOAT;
      NEXT();
    } else if (IsIdent("double") || IsIdent("float64")) {
      type.base_type = BASE_TYPE_DOUBLE;
      NEXT();
    } else if (IsIdent("string")) {
      type.base_type = BASE_TYPE_STRING;
      NEXT();
    } else {
      ECHECK(ParseTypeIdent(type));
    }
  } else if (token_ == '[') {
    ParseDepthGuard depth_guard(this);
    ECHECK(depth_guard.Check());
    NEXT();
    Type subtype;
    ECHECK(ParseType(subtype));
    if (IsSeries(subtype)) {
      // We could support this, but it will complicate things, and it's
      // easier to work around with a struct around the inner vector.
      return Error("nested vector types not supported (wrap in table first)");
    }
    if (token_ == ':') {
      NEXT();
      if (token_ != kTokenIntegerConstant) {
        return Error("length of fixed-length array must be an integer value");
      }
      uint16_t fixed_length = 0;
      bool check = StringToNumber(attribute_.c_str(), &fixed_length);
      if (!check || fixed_length < 1) {
        return Error(
            "length of fixed-length array must be positive and fit to "
            "uint16_t type");
      }
      type = Type(BASE_TYPE_ARRAY, subtype.struct_def, subtype.enum_def,
                  fixed_length);
      NEXT();
    } else {
      type = Type(BASE_TYPE_VECTOR, subtype.struct_def, subtype.enum_def);
    }
    type.element = subtype.base_type;
    EXPECT(']');
  } else {
    return Error("illegal type syntax");
  }
  return NoError();
}